

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

void __thiscall GlobOpt::EmitIntRangeChecks(GlobOpt *this,Instr *instr,Opnd *opnd)

{
  long lVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  OpndKind OVar5;
  int32 bound;
  int32 bound_00;
  undefined4 *puVar6;
  StackSym *this_00;
  GlobOptBlockData *this_01;
  Value *pVVar7;
  IntBoundedValueInfo *pIVar8;
  IntRangeValueInfo *pIVar9;
  undefined1 local_40 [8];
  Instr *instr_local;
  RegOpnd *regOpnd;
  anon_class_16_2_c0c38448 EmitBoundCheck;
  
  if ((opnd != (Opnd *)0x0) &&
     ((local_40 = (undefined1  [8])instr, OVar3 = IR::Opnd::GetKind(opnd), OVar3 == OpndKindReg ||
      (OVar3 = IR::Opnd::GetKind(opnd), OVar3 == OpndKindIndir)))) {
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 == OpndKindIndir) {
      OVar3 = IR::Opnd::GetKind(opnd);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_004accc6;
        *puVar6 = 0;
      }
      lVar1._0_2_ = opnd[1].m_valueType;
      lVar1._2_1_ = opnd[1].m_type;
      lVar1._3_1_ = opnd[1].field_0xb;
      lVar1._4_1_ = opnd[1].m_kind;
      lVar1._5_1_ = opnd[1].isDeleted;
      lVar1._6_2_ = *(undefined2 *)&opnd[1].field_0xe;
      if (lVar1 == 0) {
        return;
      }
    }
    OVar3 = IR::Opnd::GetKind(opnd);
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar3 == OpndKindReg) {
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_004accc6:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
    else {
      if (OVar5 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_004accc6;
        *puVar6 = 0;
      }
      opnd = *(Opnd **)&opnd[1].m_valueType;
    }
    if ((((Instr *)opnd)->field_0xa | TyInt64) == TyUint32) {
      instr_local = (Instr *)opnd;
      this_00 = IR::Opnd::GetStackSym(opnd);
      if ((this_00->field_0x1a & 1) != 0) {
        this_00 = StackSym::GetVarEquivSym_NoCreate(this_00);
      }
      this_01 = CurrentBlockData(this);
      pVVar7 = GlobOptBlockData::FindValue(this_01,&this_00->super_Sym);
      if (pVVar7 != (Value *)0x0) {
        bVar4 = ValueInfo::IsIntBounded(pVVar7->valueInfo);
        if (bVar4) {
          pIVar8 = ValueInfo::AsIntBounded(pVVar7->valueInfo);
          bound = IntBounds::ConstantLowerBound(pIVar8->bounds);
          pIVar8 = ValueInfo::AsIntBounded(pVVar7->valueInfo);
          bound_00 = IntBounds::ConstantUpperBound(pIVar8->bounds);
        }
        else {
          bVar4 = ValueInfo::IsIntRange(pVVar7->valueInfo);
          if (!bVar4) {
            return;
          }
          pIVar9 = ValueInfo::AsIntRange(pVVar7->valueInfo);
          bound = (pIVar9->super_IntConstantBounds).lowerBound;
          pIVar9 = ValueInfo::AsIntRange(pVVar7->valueInfo);
          bound_00 = (pIVar9->super_IntConstantBounds).upperBound;
        }
        regOpnd = (RegOpnd *)local_40;
        EmitBoundCheck.instr = &instr_local;
        EmitIntRangeChecks::anon_class_16_2_c0c38448::operator()
                  ((anon_class_16_2_c0c38448 *)&regOpnd,CheckLowerIntBound,bound);
        if (bound_00 != 0x7fffffff) {
          EmitIntRangeChecks::anon_class_16_2_c0c38448::operator()
                    ((anon_class_16_2_c0c38448 *)&regOpnd,CheckUpperIntBound,bound_00);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::EmitIntRangeChecks(IR::Instr* instr, IR::Opnd* opnd)
{
    if (!opnd || 
        (!opnd->IsRegOpnd() && !opnd->IsIndirOpnd()) ||
        (opnd->IsIndirOpnd() && !opnd->AsIndirOpnd()->GetIndexOpnd()))
    {
        return;
    }

    IR::RegOpnd * regOpnd = opnd->IsRegOpnd() ? opnd->AsRegOpnd() : opnd->AsIndirOpnd()->GetIndexOpnd();
    if (!(regOpnd->IsInt32() || regOpnd->IsUInt32()))
    {
        return;
    }
    
    StackSym * sym = regOpnd->GetStackSym();
    if (sym->IsTypeSpec())
    {
        sym = sym->GetVarEquivSym_NoCreate();
    }
    
    Value * value = CurrentBlockData()->FindValue(sym);

    if (!value)
    {
        return;
    }

    int32 lowerBound = INT_MIN;
    int32 upperBound = INT_MAX;
    
    if (value->GetValueInfo()->IsIntBounded())
    {
        lowerBound = value->GetValueInfo()->AsIntBounded()->Bounds()->ConstantLowerBound();
        upperBound = value->GetValueInfo()->AsIntBounded()->Bounds()->ConstantUpperBound();
    }
    else if (value->GetValueInfo()->IsIntRange())
    {
        lowerBound = value->GetValueInfo()->AsIntRange()->LowerBound();
        upperBound = value->GetValueInfo()->AsIntRange()->UpperBound();
    }
    else
    {
        return;
    }

    const auto EmitBoundCheck = [&](Js::OpCode opcode, int32 bound)
    {
        IR::Opnd * boundOpnd = IR::IntConstOpnd::New(bound, TyInt32, instr->m_func, true /*dontEncode*/);
        IR::Instr * boundCheckInstr = IR::Instr::New(opcode, instr->m_func);
        boundCheckInstr->SetSrc1(regOpnd);
        boundCheckInstr->SetSrc2(boundOpnd);
        instr->InsertBefore(boundCheckInstr);
    };

    if (lowerBound > INT_MIN)
    {
        EmitBoundCheck(Js::OpCode::CheckLowerIntBound, lowerBound);
    }
    if (upperBound < INT_MAX)
    {
        EmitBoundCheck(Js::OpCode::CheckUpperIntBound, upperBound);
    }
}